

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O3

bool mocker::detail::runOptPassImpl<mocker::SimplifyPhiFunctions>(Module *module,FuncPass *param_2)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  bool bVar3;
  SimplifyPhiFunctions SStack_28;
  
  bVar3 = false;
  for (p_Var1 = (module->funcs)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    if (*(char *)&p_Var1[0x11]._M_nxt == '\0') {
      SimplifyPhiFunctions::SimplifyPhiFunctions(&SStack_28,(FunctionModule *)(p_Var1 + 5));
      bVar2 = SimplifyPhiFunctions::operator()(&SStack_28);
      bVar3 = (bool)(bVar3 | bVar2);
    }
  }
  return bVar3;
}

Assistant:

bool runOptPassImpl(ir::Module &module, FuncPass *, Args &&... args) {
  auto res = false;
  for (auto &func : module.getFuncs()) {
    if (func.second.isExternalFunc())
      continue;
    res |= Pass{func.second, std::forward<Args>(args)...}();
  }
  return res;
}